

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# publication.cpp
# Opt level: O0

XmlRpcValue __thiscall miniros::Publication::getStats(Publication *this)

{
  bool bVar1;
  element_type *peVar2;
  anon_union_8_8_d5adaace_for__value extraout_RDX;
  anon_union_8_8_d5adaace_for__value extraout_RDX_00;
  anon_union_8_8_d5adaace_for__value aVar3;
  XmlRpcValue *in_RDI;
  XmlRpcValue XVar4;
  Stats *s;
  iterator c;
  uint32_t cidx;
  scoped_lock<std::mutex> lock;
  XmlRpcValue conn_data;
  XmlRpcValue *stats;
  undefined4 in_stack_fffffffffffffee8;
  int in_stack_fffffffffffffeec;
  XmlRpcValue *in_stack_fffffffffffffef0;
  string *in_stack_ffffffffffffff08;
  XmlRpcValue *in_stack_ffffffffffffff10;
  XmlRpcValue *in_stack_ffffffffffffff18;
  XmlRpcValue *in_stack_ffffffffffffff20;
  XmlRpcValue *in_stack_ffffffffffffff28;
  XmlRpcValue *in_stack_ffffffffffffff30;
  __normal_iterator<std::shared_ptr<miniros::SubscriberLink>_*,_std::vector<std::shared_ptr<miniros::SubscriberLink>,_std::allocator<std::shared_ptr<miniros::SubscriberLink>_>_>_>
  local_60;
  int local_54;
  XmlRpcValue local_48 [3];
  byte local_11;
  
  local_11 = 0;
  XmlRpc::XmlRpcValue::XmlRpcValue(in_RDI);
  XmlRpc::XmlRpcValue::XmlRpcValue(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  XmlRpc::XmlRpcValue::operator[](in_stack_fffffffffffffef0,in_stack_fffffffffffffeec);
  XmlRpc::XmlRpcValue::operator=(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  XmlRpc::XmlRpcValue::~XmlRpcValue((XmlRpcValue *)0x4896af);
  XmlRpc::XmlRpcValue::XmlRpcValue(local_48);
  XmlRpc::XmlRpcValue::setSize(in_stack_fffffffffffffef0,in_stack_fffffffffffffeec);
  std::scoped_lock<std::mutex>::scoped_lock
            ((scoped_lock<std::mutex> *)in_stack_fffffffffffffef0,
             (mutex_type *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  local_54 = 0;
  local_60._M_current =
       (shared_ptr<miniros::SubscriberLink> *)
       std::
       vector<std::shared_ptr<miniros::SubscriberLink>,_std::allocator<std::shared_ptr<miniros::SubscriberLink>_>_>
       ::begin((vector<std::shared_ptr<miniros::SubscriberLink>,_std::allocator<std::shared_ptr<miniros::SubscriberLink>_>_>
                *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  while( true ) {
    std::
    vector<std::shared_ptr<miniros::SubscriberLink>,_std::allocator<std::shared_ptr<miniros::SubscriberLink>_>_>
    ::end((vector<std::shared_ptr<miniros::SubscriberLink>,_std::allocator<std::shared_ptr<miniros::SubscriberLink>_>_>
           *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<std::shared_ptr<miniros::SubscriberLink>_*,_std::vector<std::shared_ptr<miniros::SubscriberLink>,_std::allocator<std::shared_ptr<miniros::SubscriberLink>_>_>_>
                        *)in_stack_fffffffffffffef0,
                       (__normal_iterator<std::shared_ptr<miniros::SubscriberLink>_*,_std::vector<std::shared_ptr<miniros::SubscriberLink>,_std::allocator<std::shared_ptr<miniros::SubscriberLink>_>_>_>
                        *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<miniros::SubscriberLink>_*,_std::vector<std::shared_ptr<miniros::SubscriberLink>,_std::allocator<std::shared_ptr<miniros::SubscriberLink>_>_>_>
    ::operator*(&local_60);
    peVar2 = std::
             __shared_ptr_access<miniros::SubscriberLink,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<miniros::SubscriberLink,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x489763);
    SubscriberLink::getStats(peVar2);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<miniros::SubscriberLink>_*,_std::vector<std::shared_ptr<miniros::SubscriberLink>,_std::allocator<std::shared_ptr<miniros::SubscriberLink>_>_>_>
    ::operator*(&local_60);
    peVar2 = std::
             __shared_ptr_access<miniros::SubscriberLink,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<miniros::SubscriberLink,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x489794);
    SubscriberLink::getConnectionID(peVar2);
    XmlRpc::XmlRpcValue::operator[](in_stack_fffffffffffffef0,in_stack_fffffffffffffeec);
    XmlRpc::XmlRpcValue::operator[](in_stack_fffffffffffffef0,in_stack_fffffffffffffeec);
    XmlRpc::XmlRpcValue::operator=(in_stack_ffffffffffffff20,(int *)in_stack_ffffffffffffff18);
    in_stack_ffffffffffffff30 =
         XmlRpc::XmlRpcValue::operator[](in_stack_fffffffffffffef0,in_stack_fffffffffffffeec);
    in_stack_ffffffffffffff28 =
         XmlRpc::XmlRpcValue::operator[](in_stack_fffffffffffffef0,in_stack_fffffffffffffeec);
    XmlRpc::XmlRpcValue::operator=(in_stack_ffffffffffffff20,(int *)in_stack_ffffffffffffff18);
    in_stack_ffffffffffffff20 =
         XmlRpc::XmlRpcValue::operator[](in_stack_fffffffffffffef0,in_stack_fffffffffffffeec);
    in_stack_ffffffffffffff18 =
         XmlRpc::XmlRpcValue::operator[](in_stack_fffffffffffffef0,in_stack_fffffffffffffeec);
    XmlRpc::XmlRpcValue::operator=(in_stack_ffffffffffffff20,(int *)in_stack_ffffffffffffff18);
    XmlRpc::XmlRpcValue::operator[](in_stack_fffffffffffffef0,in_stack_fffffffffffffeec);
    XmlRpc::XmlRpcValue::operator[](in_stack_fffffffffffffef0,in_stack_fffffffffffffeec);
    XmlRpc::XmlRpcValue::operator=(in_stack_ffffffffffffff20,(int *)in_stack_ffffffffffffff18);
    XmlRpc::XmlRpcValue::operator[](in_stack_fffffffffffffef0,in_stack_fffffffffffffeec);
    XmlRpc::XmlRpcValue::operator[](in_stack_fffffffffffffef0,in_stack_fffffffffffffeec);
    XmlRpc::XmlRpcValue::operator=(in_stack_ffffffffffffff20,(int *)in_stack_ffffffffffffff18);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<miniros::SubscriberLink>_*,_std::vector<std::shared_ptr<miniros::SubscriberLink>,_std::allocator<std::shared_ptr<miniros::SubscriberLink>_>_>_>
    ::operator++(&local_60);
    local_54 = local_54 + 1;
  }
  XmlRpc::XmlRpcValue::operator[](in_stack_fffffffffffffef0,in_stack_fffffffffffffeec);
  XmlRpc::XmlRpcValue::operator=(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  local_11 = 1;
  std::scoped_lock<std::mutex>::~scoped_lock((scoped_lock<std::mutex> *)0x489a1f);
  XmlRpc::XmlRpcValue::~XmlRpcValue((XmlRpcValue *)0x489a2c);
  aVar3 = extraout_RDX;
  if ((local_11 & 1) == 0) {
    XmlRpc::XmlRpcValue::~XmlRpcValue((XmlRpcValue *)0x489a51);
    aVar3 = extraout_RDX_00;
  }
  XVar4._value.asDouble = aVar3.asDouble;
  XVar4._0_8_ = in_RDI;
  return XVar4;
}

Assistant:

XmlRpc::XmlRpcValue Publication::getStats()
{
  XmlRpc::XmlRpcValue stats;
  stats[0] = name_;
  XmlRpc::XmlRpcValue conn_data;
  conn_data.setSize(0); // force to be an array, even if it's empty

  std::scoped_lock<std::mutex> lock(subscriber_links_mutex_);

  uint32_t cidx = 0;
  for (V_SubscriberLink::iterator c = subscriber_links_.begin();
       c != subscriber_links_.end(); ++c, cidx++)
  {
    const SubscriberLink::Stats& s = (*c)->getStats();
    conn_data[cidx][0] = (*c)->getConnectionID();
    // todo: figure out what to do here... the bytes_sent will wrap around
    // on some flows within a reasonable amount of time. xmlrpc++ doesn't
    // seem to give me a nice way to do 64-bit ints, perhaps that's a
    // limitation of xml-rpc, not sure. alternatively we could send the number
    // of KB transmitted to gain a few order of magnitude.
    conn_data[cidx][1] = (int)s.bytes_sent_;
    conn_data[cidx][2] = (int)s.message_data_sent_;
    conn_data[cidx][3] = (int)s.messages_sent_;
    conn_data[cidx][4] = 0; // not sure what is meant by connected
  }

  stats[1] = conn_data;
  return stats;
}